

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O0

bool __thiscall ForbiddenPointFinder::isDoubleThree(ForbiddenPointFinder *this,int x,int y)

{
  bool bVar1;
  int local_28;
  int local_24;
  int i;
  int nThree;
  int y_local;
  int x_local;
  ForbiddenPointFinder *this_local;
  
  if (this->cBoard[x + 1][y + 1] == Empty) {
    bVar1 = isFive(this,x,y,0);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_24 = 0;
      for (local_28 = 1; local_28 < 5; local_28 = local_28 + 1) {
        bVar1 = isOpenThree(this,x,y,0,local_28);
        if (bVar1) {
          local_24 = local_24 + 1;
        }
      }
      if (local_24 < 2) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ForbiddenPointFinder::isDoubleThree(int x, int y) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    if (isFive(x, y, 0))    // five?
        return false;

    int nThree = 0;
    for (int i = 1; i <= 4; i++) {
        if (isOpenThree(x, y, 0, i))
            nThree++;
    }

    if (nThree >= 2)
        return true;
    else
        return false;
}